

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_test.cc
# Opt level: O2

void __thiscall
RegisterLexerReadVarValue::RegisterLexerReadVarValue(RegisterLexerReadVarValue *this)

{
  RegisterTest(LexerReadVarValue::Create,"Lexer.ReadVarValue");
  return;
}

Assistant:

TEST(Lexer, ReadVarValue) {
  Lexer lexer("plain text $var $VaR ${x}\n");
  EvalString eval;
  string err;
  EXPECT_TRUE(lexer.ReadVarValue(&eval, &err));
  EXPECT_EQ("", err);
  EXPECT_EQ("[plain text ][$var][ ][$VaR][ ][$x]",
            eval.Serialize());
}